

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

Version * __thiscall google::protobuf::compiler::Version::New(Version *this,Arena *arena)

{
  Version *this_00;
  
  this_00 = (Version *)operator_new(0x30);
  Version(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::compiler::Version>(arena,this_00);
  }
  return this_00;
}

Assistant:

Version* Version::New(::google::protobuf::Arena* arena) const {
  Version* n = new Version;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}